

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O2

void __thiscall gulcalc::correlatedoutputgul(gulcalc *this,gulitemSampleslevel *gg)

{
  OASIS_FLOAT OVar1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  
  if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    iVar4 = this->correlatedbufoffset_;
    if (15999 < iVar4) {
      (*this->correlatedWriter_)(this->corrbuf_,1,iVar4);
      this->correlatedbufoffset_ = 0;
      iVar4 = 0;
    }
    iVar3 = gg->event_id;
    if ((iVar3 != lastcorrelatedheader.event_id) || (gg->item_id != lastcorrelatedheader.item_id)) {
      if (this->isFirstCorrelatedEvent_ == false) {
        puVar2 = this->corrbuf_ + iVar4;
        puVar2[0] = '\0';
        puVar2[1] = '\0';
        puVar2[2] = '\0';
        puVar2[3] = '\0';
        puVar2[4] = '\0';
        puVar2[5] = '\0';
        puVar2[6] = '\0';
        puVar2[7] = '\0';
        iVar4 = this->correlatedbufoffset_ + 8;
        this->correlatedbufoffset_ = iVar4;
        iVar3 = gg->event_id;
      }
      else {
        this->isFirstCorrelatedEvent_ = false;
      }
      lastcorrelatedheader.item_id = gg->item_id;
      lastcorrelatedheader.event_id = iVar3;
      *(ulong *)(this->corrbuf_ + iVar4) = CONCAT44(lastcorrelatedheader.item_id,iVar3);
      iVar4 = this->correlatedbufoffset_ + 8;
      this->correlatedbufoffset_ = iVar4;
    }
    OVar1 = gg->loss;
    puVar2 = this->corrbuf_;
    *(int *)(puVar2 + iVar4) = gg->sidx;
    *(OASIS_FLOAT *)(puVar2 + (long)iVar4 + 4) = OVar1;
    this->correlatedbufoffset_ = this->correlatedbufoffset_ + 8;
  }
  return;
}

Assistant:

void gulcalc::correlatedoutputgul(gulitemSampleslevel &gg)
{
	if (correlatedWriter_ == 0) return;
	if (correlatedbufoffset_ >= bufsize) {
		correlatedWriter_(corrbuf_, sizeof(unsigned char), correlatedbufoffset_);
		correlatedbufoffset_ = 0;
	}

	if(gg.event_id != lastcorrelatedheader.event_id || gg.item_id != lastcorrelatedheader.item_id) {
		if (isFirstCorrelatedEvent_ == false) {
			gulSampleslevelRec r;
			r.sidx = 0;
			r.loss = 0;
			memcpy(corrbuf_ + correlatedbufoffset_, &r, sizeof(gulSampleslevelRec));
			correlatedbufoffset_ += sizeof(gulSampleslevelRec);
		}
		else {
			isFirstCorrelatedEvent_ = false;
		}
		lastcorrelatedheader.event_id = gg.event_id;
		lastcorrelatedheader.item_id = gg.item_id;
		memcpy(corrbuf_ + correlatedbufoffset_, &lastcorrelatedheader, sizeof(lastcorrelatedheader));
		correlatedbufoffset_ += sizeof(lastcorrelatedheader);
	}

	gulSampleslevelRec r;
	r.sidx = gg.sidx;
	r.loss = gg.loss;
	memcpy(corrbuf_ + correlatedbufoffset_, &r, sizeof(gulSampleslevelRec));
	correlatedbufoffset_ += sizeof(gulSampleslevelRec);

}